

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall
xray_re::xr_vbuf::xr_vbuf
          (xr_vbuf *this,size_t n,fvector3 *points,fvector3 *normals,fvector2 *texcoords)

{
  _vector3<float> *p_Var1;
  _vector2<float> *p_Var2;
  
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_vbuf_00238858;
  this->m_colors = (fcolor *)0x0;
  this->m_lightmaps = (fvector2 *)0x0;
  this->m_influences = (finfluence *)0x0;
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf).m_size = n;
  p_Var1 = xr_flexbuf::duplicate<xray_re::_vector3<float>>(&this->super_xr_flexbuf,points);
  this->m_points = p_Var1;
  p_Var1 = xr_flexbuf::duplicate<xray_re::_vector3<float>>(&this->super_xr_flexbuf,normals);
  this->m_normals = p_Var1;
  p_Var2 = xr_flexbuf::duplicate<xray_re::_vector2<float>>(&this->super_xr_flexbuf,texcoords);
  this->m_texcoords = p_Var2;
  make_signature(this);
  return;
}

Assistant:

xr_vbuf::xr_vbuf(size_t n, const fvector3* points, const fvector3* normals, const fvector2* texcoords):
	m_lightmaps(0), m_influences(0), m_colors(0)
{
	set_owner(true);
	set_size(n);
	m_points = duplicate(points);
	m_normals = duplicate(normals);
	m_texcoords = duplicate(texcoords);
	make_signature();
}